

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void init_step(void)

{
  int iVar1;
  Person *person;
  int *piVar2;
  Admin *person_00;
  
  person = (Person *)operator_new(0x60);
  person->_vptr_Person = (_func_int **)&PTR_CheckPassword_00108d98;
  person->gender = true;
  person->id = 0;
  person->access_level = 0;
  person->num_groups = 0;
  piVar2 = (int *)operator_new__(0);
  person->groups = piVar2;
  iVar1 = Person::last_id + 1;
  person->id = Person::last_id;
  Person::last_id = iVar1;
  person->name = "Admin";
  person->surname = "Admin";
  person->gender = true;
  person->age = 0x14;
  person_00 = (Admin *)operator_new(0x60);
  Admin::Admin(person_00,person,"toor");
  Admin::addNewPerson(person_00,(Person *)person_00);
  return;
}

Assistant:

void init_step(){
    char *name = (char*)"Admin";
    char* surname = (char*)"Admin";
    char* pass1 = (char*)"toor";
    Person* first_person = new Person(true,name,surname,20);
    Admin* first_admin = new Admin(first_person,pass1);
    first_admin->addNewPerson(first_admin);

}